

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O0

Pass * wasm::createFuncCastEmulationPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  FuncCastEmulation::FuncCastEmulation((FuncCastEmulation *)this);
  return this;
}

Assistant:

Pass* createFuncCastEmulationPass() { return new FuncCastEmulation(); }